

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRule.c
# Opt level: O0

void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *p,int iLit,Vec_Int_t **pvSyms)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Kit_DsdObj_t *pKVar4;
  Kit_DsdObj_t *pKVar5;
  Vec_Int_t *pVVar6;
  int local_30;
  int iFanin;
  int k;
  int i;
  Kit_DsdObj_t *pObj;
  Vec_Int_t **pvSyms_local;
  int iLit_local;
  Kit_DsdNtk_t *p_local;
  
  iVar1 = Abc_LitIsCompl(iLit);
  if (iVar1 != 0) {
    __assert_fail("!Abc_LitIsCompl(iLit)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                  ,0x124,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
  }
  iVar1 = Abc_Lit2Var(iLit);
  pKVar4 = Kit_DsdNtkObj(p,iVar1);
  if (pKVar4 != (Kit_DsdObj_t *)0x0) {
    for (iFanin = 0; iFanin < (int)((uint)*pKVar4 >> 0x1a); iFanin = iFanin + 1) {
      iVar1 = Abc_LitRegular((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)iFanin * 2));
      Amap_CreateCheckAsym_rec(p,iVar1,pvSyms);
    }
    if (((uint)*pKVar4 >> 6 & 7) != 5) {
      if ((((uint)*pKVar4 >> 6 & 7) != 3) && (((uint)*pKVar4 >> 6 & 7) != 4)) {
        __assert_fail("pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/amap/amapRule.c"
                      ,300,"void Amap_CreateCheckAsym_rec(Kit_DsdNtk_t *, int, Vec_Int_t **)");
      }
      for (iFanin = 0; local_30 = iFanin, iFanin < (int)((uint)*pKVar4 >> 0x1a); iFanin = iFanin + 1
          ) {
        while (local_30 = local_30 + 1, local_30 < (int)((uint)*pKVar4 >> 0x1a)) {
          iVar1 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)iFanin * 2));
          iVar2 = Abc_LitIsCompl((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)local_30 * 2));
          if (iVar1 != iVar2) {
            iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)iFanin * 2));
            pKVar5 = Kit_DsdNtkObj(p,iVar1);
            if (pKVar5 == (Kit_DsdObj_t *)0x0) {
              iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)local_30 * 2));
              pKVar5 = Kit_DsdNtkObj(p,iVar1);
              if (pKVar5 == (Kit_DsdObj_t *)0x0) {
                if (*pvSyms == (Vec_Int_t *)0x0) {
                  pVVar6 = Vec_IntAlloc(0x10);
                  *pvSyms = pVVar6;
                }
                pVVar6 = *pvSyms;
                iVar1 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)iFanin * 2));
                uVar3 = Abc_Lit2Var((uint)*(ushort *)(&pKVar4[1].field_0x0 + (long)local_30 * 2));
                Vec_IntPush(pVVar6,iVar1 << 8 | uVar3);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Amap_CreateCheckAsym_rec( Kit_DsdNtk_t * p, int iLit, Vec_Int_t ** pvSyms )
{
    Kit_DsdObj_t * pObj; 
    int i, k, iFanin;
    assert( !Abc_LitIsCompl(iLit) );
    pObj = Kit_DsdNtkObj( p, Abc_Lit2Var(iLit) );
    if ( pObj == NULL )
        return;
    Kit_DsdObjForEachFanin( p, pObj, iFanin, i )
        Amap_CreateCheckAsym_rec( p, Abc_LitRegular(iFanin), pvSyms );
    if ( pObj->Type == KIT_DSD_PRIME )
        return;
    assert( pObj->Type == KIT_DSD_AND || pObj->Type == KIT_DSD_XOR );
    for ( i = 0; i < (int)pObj->nFans; i++ )
    for ( k = i+1; k < (int)pObj->nFans; k++ )
    {
        if ( Abc_LitIsCompl(pObj->pFans[i]) != Abc_LitIsCompl(pObj->pFans[k]) && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[i])) == NULL && 
             Kit_DsdNtkObj(p, Abc_Lit2Var(pObj->pFans[k])) == NULL )
        {
            if ( *pvSyms == NULL )
                *pvSyms = Vec_IntAlloc( 16 );
            Vec_IntPush( *pvSyms, (Abc_Lit2Var(pObj->pFans[i]) << 8) | Abc_Lit2Var(pObj->pFans[k]) );
        }
    }
}